

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::~IfcCondition(IfcCondition *this)

{
  ~IfcCondition(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}